

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_setmetatable(lua_State *L,int idx)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  GCobj *o;
  TValue *pTVar4;
  ulong uVar5;
  ulong uVar6;
  global_State *g;
  undefined4 uVar7;
  GCobj *o_00;
  
  pTVar4 = index2adr(L,idx);
  if (*(int *)((long)L->top + -4) == -1) {
    o_00 = (GCobj *)0x0;
  }
  else {
    o_00 = (GCobj *)(ulong)L->top[-1].u32.lo;
  }
  uVar7 = SUB84(o_00,0);
  if ((pTVar4->field_2).it == 0xfffffff3) {
    *(undefined4 *)((ulong)(pTVar4->u32).lo + 0x10) = uVar7;
    if ((o_00 != (GCobj *)0x0) && (((o_00->gch).marked & 3) != 0)) {
      bVar1 = *(byte *)((ulong)(pTVar4->u32).lo + 4);
      if ((bVar1 & 4) != 0) {
        g = (global_State *)(ulong)(L->glref).ptr32;
        if ((byte)((g->gc).state - 1) < 2) {
          gc_mark(g,o_00);
        }
        else {
          *(byte *)((ulong)(pTVar4->u32).lo + 4) = (g->gc).currentwhite & 3 | bVar1 & 0xf8;
        }
      }
    }
  }
  else if ((pTVar4->field_2).it == 0xfffffff4) {
    *(undefined4 *)((ulong)(pTVar4->u32).lo + 0x10) = uVar7;
    if ((o_00 != (GCobj *)0x0) && (((o_00->gch).marked & 3) != 0)) {
      uVar2 = (pTVar4->u32).lo;
      uVar5 = (ulong)uVar2;
      if ((*(byte *)(uVar5 + 4) & 4) != 0) {
        uVar6 = (ulong)(L->glref).ptr32;
        *(byte *)(uVar5 + 4) = *(byte *)(uVar5 + 4) & 0xfb;
        *(undefined4 *)(uVar5 + 0xc) = *(undefined4 *)(uVar6 + 0x3c);
        *(uint *)(uVar6 + 0x3c) = uVar2;
      }
    }
  }
  else {
    uVar5 = (ulong)(L->glref).ptr32;
    iVar3 = lj_trace_flushall(L);
    if (iVar3 != 0) {
      lj_err_caller(L,LJ_ERR_NOGCMM);
    }
    uVar2 = (pTVar4->field_2).it;
    if (uVar2 + 3 < 2) {
      *(undefined4 *)(uVar5 + 0x160) = uVar7;
      *(undefined4 *)(uVar5 + 0x15c) = uVar7;
    }
    else {
      uVar6 = 0x23;
      if ((0xfffeffff < uVar2) && (uVar6 = 0x19, (uVar2 & 0xffff8000) != 0xffff0000)) {
        uVar6 = (ulong)(0x15 - uVar2);
      }
      *(undefined4 *)(uVar5 + 0x100 + uVar6 * 4) = uVar7;
    }
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable(lua_State *L, int idx)
{
  global_State *g;
  GCtab *mt;
  cTValue *o = index2adr(L, idx);
  api_checknelems(L, 1);
  api_checkvalidindex(L, o);
  if (tvisnil(L->top-1)) {
    mt = NULL;
  } else {
    api_check(L, tvistab(L->top-1));
    mt = tabV(L->top-1);
  }
  g = G(L);
  if (tvistab(o)) {
    setgcref(tabV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarriert(L, tabV(o), mt);
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarrier(L, udataV(o), mt);
  } else {
    /* Flush cache, since traces specialize to basemt. But not during __gc. */
    if (lj_trace_flushall(L))
      lj_err_caller(L, LJ_ERR_NOGCMM);
    if (tvisbool(o)) {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_it(g, LJ_TTRUE), obj2gco(mt));
      setgcref(basemt_it(g, LJ_TFALSE), obj2gco(mt));
    } else {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_obj(g, o), obj2gco(mt));
    }
  }
  L->top--;
  return 1;
}